

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O1

void __thiscall ExecutionEngine::i_fsub(ExecutionEngine *this)

{
  VMStack *this_00;
  Frame *this_01;
  ulong uVar1;
  Value VVar2;
  Value VVar3;
  
  this_00 = VMStack::getInstance();
  this_01 = VMStack::getTopFrame(this_00);
  VVar2 = Frame::popTopOfOperandStack(this_01);
  VVar3 = Frame::popTopOfOperandStack(this_01);
  uVar1 = VVar3._0_8_;
  if (VVar2.type != FLOAT) {
    __assert_fail("value_2.type == ValueType::FLOAT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                  ,0x80a,"void ExecutionEngine::i_fsub()");
  }
  if ((uVar1 & 0xffffffff00000000) == 0x500000000) {
    VVar2.data.longValue =
         (ulong)(uint)(VVar3.data._0_4_ - VVar2.data._0_4_) |
         VVar3.data.longValue & 0xffffffff00000000U;
    VVar2.printType = (int)uVar1;
    VVar2.type = (int)(uVar1 >> 0x20);
    Frame::pushIntoOperandStack(this_01,VVar2);
    this_01->pc = this_01->pc + 1;
    return;
  }
  __assert_fail("value_1.type == ValueType::FLOAT",
                "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                ,0x80b,"void ExecutionEngine::i_fsub()");
}

Assistant:

void ExecutionEngine::i_fsub() {
	VMStack &stackFrame = VMStack::getInstance();
	Frame *topFrame = stackFrame.getTopFrame();

	Value value_2 = topFrame->popTopOfOperandStack();
	Value value_1 = topFrame->popTopOfOperandStack();

	assert(value_2.type == ValueType::FLOAT);
	assert(value_1.type == ValueType::FLOAT);

	value_1.data.floatValue = value_1.data.floatValue - (value_2.data.floatValue);
	topFrame->pushIntoOperandStack(value_1);

	topFrame->pc += 1;
}